

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O2

void __thiscall Downloader::saveFile(Downloader *this,qint64 received,qint64 total)

{
  char cVar1;
  QUrl url;
  QFile file;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_28;
  
  QNetworkReply::attribute((Attribute)&local_48);
  QVariant::toUrl();
  QVariant::~QVariant((QVariant *)&local_48);
  cVar1 = QUrl::isEmpty();
  if (cVar1 == '\0') {
    startDownload(this,&url);
  }
  else {
    operator+((QString *)&local_28,&this->m_fileName,&PARTIAL_DOWN);
    QDir::filePath((QString *)&local_48);
    QFile::QFile(&file,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    cVar1 = QFile::open(&file,6);
    if (cVar1 != '\0') {
      QIODevice::readAll();
      QIODevice::write((QByteArray *)&file);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
      QFileDevice::close();
    }
    QFile::~QFile(&file);
  }
  QUrl::~QUrl(&url);
  return;
}

Assistant:

void Downloader::saveFile(qint64 received, qint64 total)
{
   Q_UNUSED(received);
   Q_UNUSED(total);

   /* Check if we need to redirect */
   QUrl url = m_reply->attribute(QNetworkRequest::RedirectionTargetAttribute).toUrl();
   if (!url.isEmpty())
   {
      startDownload(url);
      return;
   }

   /* Save downloaded data to disk */
   QFile file(m_downloadDir.filePath(m_fileName + PARTIAL_DOWN));
   if (file.open(QIODevice::WriteOnly | QIODevice::Append))
   {
      file.write(m_reply->readAll());
      file.close();
   }
}